

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O0

int PixarLogPostEncode(TIFF *tif)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  char *local_38;
  int state;
  PixarLogState *sp;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  do {
    uVar2 = deflate((z_streamp)(puVar1 + 0x80),4);
    if (1 < uVar2) {
      if (*(long *)(puVar1 + 0xb0) == 0) {
        local_38 = "(null)";
      }
      else {
        local_38 = *(char **)(puVar1 + 0xb0);
      }
      TIFFErrorExtR(tif,"PixarLogPostEncode","ZLib error: %s",local_38);
      return 0;
    }
    if ((ulong)*(uint *)(puVar1 + 0xa0) != tif->tif_rawdatasize) {
      tif->tif_rawcc = tif->tif_rawdatasize - (ulong)*(uint *)(puVar1 + 0xa0);
      iVar3 = TIFFFlushData1(tif);
      if (iVar3 == 0) {
        return 0;
      }
      *(uint8_t **)(puVar1 + 0x98) = tif->tif_rawdata;
      *(int *)(puVar1 + 0xa0) = (int)tif->tif_rawdatasize;
    }
  } while (uVar2 != 1);
  return 1;
}

Assistant:

static int PixarLogPostEncode(TIFF *tif)
{
    static const char module[] = "PixarLogPostEncode";
    PixarLogState *sp = EncoderState(tif);
    int state;

    sp->stream.avail_in = 0;

    do
    {
        state = deflate(&sp->stream, Z_FINISH);
        switch (state)
        {
            case Z_STREAM_END:
            case Z_OK:
                if ((tmsize_t)sp->stream.avail_out != tif->tif_rawdatasize)
                {
                    tif->tif_rawcc =
                        tif->tif_rawdatasize - sp->stream.avail_out;
                    if (!TIFFFlushData1(tif))
                        return 0;
                    sp->stream.next_out = tif->tif_rawdata;
                    sp->stream.avail_out =
                        (uInt)tif->tif_rawdatasize; /* this is a safe typecast,
                                                       as check is made already
                                                       in PixarLogPreEncode */
                }
                break;
            default:
                TIFFErrorExtR(tif, module, "ZLib error: %s",
                              sp->stream.msg ? sp->stream.msg : "(null)");
                return (0);
        }
    } while (state != Z_STREAM_END);
    return (1);
}